

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::WildcardPattern::WildcardPattern
          (WildcardPattern *this,string *pattern,Choice caseSensitivity)

{
  bool bVar1;
  string local_70 [48];
  string local_40 [36];
  Choice local_1c;
  string *psStack_18;
  Choice caseSensitivity_local;
  string *pattern_local;
  WildcardPattern *this_local;
  
  this->_vptr_WildcardPattern = (_func_int **)&PTR__WildcardPattern_00293030;
  this->m_caseSensitivity = caseSensitivity;
  this->m_wildcard = NoWildcard;
  local_1c = caseSensitivity;
  psStack_18 = pattern;
  pattern_local = (string *)this;
  normaliseString(&this->m_pattern,this,pattern);
  bVar1 = startsWith(&this->m_pattern,'*');
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)&this->m_pattern);
    std::__cxx11::string::operator=((string *)&this->m_pattern,local_40);
    std::__cxx11::string::~string(local_40);
    this->m_wildcard = WildcardAtStart;
  }
  bVar1 = endsWith(&this->m_pattern,'*');
  if (bVar1) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_70,(ulong)&this->m_pattern);
    std::__cxx11::string::operator=((string *)&this->m_pattern,local_70);
    std::__cxx11::string::~string(local_70);
    this->m_wildcard = this->m_wildcard | WildcardAtEnd;
  }
  return;
}

Assistant:

WildcardPattern::WildcardPattern( std::string const& pattern,
                                      CaseSensitive::Choice caseSensitivity )
    :   m_caseSensitivity( caseSensitivity ),
        m_pattern( normaliseString( pattern ) )
    {
        if( startsWith( m_pattern, '*' ) ) {
            m_pattern = m_pattern.substr( 1 );
            m_wildcard = WildcardAtStart;
        }
        if( endsWith( m_pattern, '*' ) ) {
            m_pattern = m_pattern.substr( 0, m_pattern.size()-1 );
            m_wildcard = static_cast<WildcardPosition>( m_wildcard | WildcardAtEnd );
        }
    }